

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,QualifiedIdentifier *qi)

{
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  *this_00;
  IdentifierPath *this_01;
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  *params;
  size_t *psVar1;
  pointer pPVar2;
  Scope *this_02;
  uint64_t uVar3;
  Expression *pEVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  Namespace *pNVar8;
  StructDeclaration *args_1;
  QualifiedIdentifier *pQVar9;
  VariableDeclaration *args_1_00;
  ProcessorBase *pPVar10;
  long lVar11;
  ProcessorInstance *args_1_01;
  EndpointDeclaration *e;
  Context *this_03;
  PathSection *p;
  pointer pPVar12;
  pool_ptr<soul::AST::Namespace> targetNamespace;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs_2;
  int itemsRemoved;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  string path;
  undefined1 local_318 [8];
  QualifiedIdentifierResolver local_310;
  IdentifierPath local_2b0;
  Expression *local_258;
  string local_250;
  NameSearch local_230;
  pool_ptr<soul::AST::Expression> local_170;
  pool_ptr<soul::AST::Expression> local_168;
  pool_ptr<soul::AST::Expression> local_160;
  pool_ptr<soul::AST::Expression> local_158;
  pool_ptr<soul::AST::Expression> local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  this_00 = &qi->pathSections;
  pPVar12 = (qi->pathSections).
            super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (qi->pathSections).
           super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar12 != pPVar2) {
    do {
      RewritingASTVisitor::replaceExpression
                ((RewritingASTVisitor *)this,&pPVar12->specialisationArgs);
      pPVar12 = pPVar12 + 1;
    } while (pPVar12 != pPVar2);
    pPVar12 = (this_00->
              super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  this_01 = &qi->pathPrefix;
  IdentifierPath::operator+((IdentifierPath *)&local_230,this_01,&pPVar12->path);
  IdentifierPath::toString_abi_cxx11_(&local_250,(IdentifierPath *)&local_230);
  local_230.itemsFound.numActive = 0;
  if ((8 < local_230.itemsFound.numAllocated) &&
     (local_230.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_230.itemsFound.items);
  }
  local_230.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_230.itemsFound.space;
  local_230.itemsFound.numActive = 0;
  local_230.itemsFound.numAllocated = 8;
  local_230.partiallyQualifiedPath.pathSections.items =
       (Identifier *)local_230.partiallyQualifiedPath.pathSections.space;
  local_230.partiallyQualifiedPath.pathSections.numActive = 0;
  local_230.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_230.stopAtFirstScopeWithResults = false;
  local_230.requiredNumFunctionArgs = -1;
  local_230.findVariables = true;
  local_230.findTypes = true;
  local_230.findFunctions = true;
  local_230.findNamespaces = true;
  local_230.findProcessors = true;
  local_230.findProcessorInstances = false;
  local_230.findEndpoints = true;
  local_230.onlyFindLocalVariables = false;
  IdentifierPath::operator+
            ((IdentifierPath *)(local_318 + 8),this_01,
             &((this_00->
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               )._M_impl.super__Vector_impl_data._M_start)->path);
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&local_230.partiallyQualifiedPath.pathSections,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)(local_318 + 8));
  local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
  super_RewritingASTVisitor.itemsReplaced = 0;
  if (((Allocator *)0x8 <
       local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.owner) &&
     ((QualifiedIdentifier *)
      local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
      super_RewritingASTVisitor._vptr_RewritingASTVisitor != (QualifiedIdentifier *)0x0)) {
    operator_delete__(local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
                      super_RewritingASTVisitor._vptr_RewritingASTVisitor);
  }
  local_230.stopAtFirstScopeWithResults = true;
  local_230._184_4_ = 0x1000101;
  local_230.findProcessors = true;
  local_230.findEndpoints = true;
  local_230.findProcessorInstances = this->parsingProcessorInstance == 0;
  this_02 = (qi->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  if (this_02 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_02,&local_230,(this->currentStatement).object);
  }
  pQVar9 = qi;
  if (local_230.itemsFound.numActive == 1) {
    uVar3 = *(uint64_t *)local_230.itemsFound.items;
    pPVar12 = (qi->pathSections).
              super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(qi->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12 == 0x60) &&
       (pEVar4 = (pPVar12->specialisationArgs).object, pEVar4 == (Expression *)0x0)) {
      if (uVar3 != 0) {
        args_1 = (StructDeclaration *)
                 __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,&AST::StructDeclaration::typeinfo);
        if (args_1 != (StructDeclaration *)0x0) {
          pQVar9 = (QualifiedIdentifier *)
                   PoolAllocator::
                   allocate<soul::AST::StructDeclarationRef,soul::AST::Context&,soul::AST::StructDeclaration&>
                             (&((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                              &(qi->super_Expression).super_Statement.super_ASTObject.context,args_1
                             );
          goto LAB_001e9bd3;
        }
        local_258 = pEVar4;
        pQVar9 = (QualifiedIdentifier *)
                 __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,&AST::Expression::typeinfo);
        if (pQVar9 != (QualifiedIdentifier *)0x0) goto LAB_001e9bd3;
        args_1_00 = (VariableDeclaration *)
                    __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,
                                   &AST::VariableDeclaration::typeinfo);
        if (args_1_00 != (VariableDeclaration *)0x0) {
          this->numVariablesResolved = this->numVariablesResolved + 1;
          pQVar9 = (QualifiedIdentifier *)
                   PoolAllocator::
                   allocate<soul::AST::VariableRef,soul::AST::Context&,soul::AST::VariableDeclaration&>
                             (&((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                              &(qi->super_Expression).super_Statement.super_ASTObject.context,
                              args_1_00);
          goto LAB_001e9bd3;
        }
        pPVar10 = (ProcessorBase *)
                  __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,&AST::ProcessorBase::typeinfo);
        if (pPVar10 != (ProcessorBase *)0x0) {
          if ((this->currentConnectionEndpoint).object == (SharedEndpoint *)0x0) {
            pQVar9 = (QualifiedIdentifier *)
                     PoolAllocator::
                     allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                               (&((this->super_ModuleInstanceResolver).
                                  super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                &(qi->super_Expression).super_Statement.super_ASTObject.context,
                                pPVar10);
          }
          else {
            local_158.object = local_258;
            AST::CommaSeparatedList::getAsExpressionList
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                       (local_318 + 8),&local_158);
            bVar6 = ModuleInstanceResolver::validateSpecialisationArgs
                              (&this->super_ModuleInstanceResolver,(ArgList *)(local_318 + 8),
                               &(pPVar10->super_ModuleBase).specialisationParams,false);
            if (bVar6) {
              local_160.object = (Expression *)0x0;
              qi = (QualifiedIdentifier *)
                   getOrCreateImplicitProcessorInstance
                             (this,&(qi->super_Expression).super_Statement.super_ASTObject.context,
                              pPVar10,&local_160);
            }
            local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
            super_RewritingASTVisitor.itemsReplaced = 0;
            pQVar9 = qi;
            if (((Allocator *)0x4 <
                 local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.owner
                ) && ((QualifiedIdentifier *)
                      local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
                      super_RewritingASTVisitor._vptr_RewritingASTVisitor !=
                      (QualifiedIdentifier *)0x0)) {
              operator_delete__(local_310.super_ModuleInstanceResolver.
                                super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
                                _vptr_RewritingASTVisitor);
            }
          }
          goto LAB_001e9bd3;
        }
        pNVar8 = (Namespace *)
                 __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,&AST::Namespace::typeinfo,0);
        if (pNVar8 != (Namespace *)0x0) {
          pQVar9 = (QualifiedIdentifier *)
                   PoolAllocator::
                   allocate<soul::AST::NamespaceRef,soul::AST::Context&,soul::AST::Namespace&>
                             (&((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                              &(qi->super_Expression).super_Statement.super_ASTObject.context,pNVar8
                             );
          goto LAB_001e9bd3;
        }
        lVar11 = __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,
                                &AST::NamespaceAliasDeclaration::typeinfo,0);
        if (lVar11 != 0) {
          if (*(Namespace **)(lVar11 + 0x40) != (Namespace *)0x0) {
            pQVar9 = (QualifiedIdentifier *)
                     PoolAllocator::
                     allocate<soul::AST::NamespaceRef,soul::AST::Context&,soul::AST::Namespace&>
                               (&((this->super_ModuleInstanceResolver).
                                  super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                &(qi->super_Expression).super_Statement.super_ASTObject.context,
                                *(Namespace **)(lVar11 + 0x40));
            goto LAB_001e9bd3;
          }
          if (*(QualifiedIdentifier **)(lVar11 + 0x30) == qi) {
            IdentifierPath::operator+((IdentifierPath *)(local_318 + 8),this_01,&pPVar12->path);
            CompileMessageHelpers::createMessage<soul::IdentifierPath>
                      (&local_a0,syntax,error,
                       "Circular reference in namespace alias definition $Q0$",
                       (IdentifierPath *)(local_318 + 8));
            AST::Context::throwError
                      (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_a0,
                       false);
          }
        }
        args_1_01 = (ProcessorInstance *)
                    __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,&AST::ProcessorInstance::typeinfo
                                   ,0);
        if (args_1_01 != (ProcessorInstance *)0x0) {
          pQVar9 = (QualifiedIdentifier *)
                   PoolAllocator::
                   allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
                             (&((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                              &(qi->super_Expression).super_Statement.super_ASTObject.context,
                              args_1_01);
          goto LAB_001e9bd3;
        }
        lVar11 = __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,
                                &AST::ProcessorAliasDeclaration::typeinfo,0);
        if ((lVar11 != 0) &&
           (pPVar10 = *(ProcessorBase **)(lVar11 + 0x38), pPVar10 != (ProcessorBase *)0x0)) {
          if ((this->currentConnectionEndpoint).object == (SharedEndpoint *)0x0) {
            pQVar9 = (QualifiedIdentifier *)
                     PoolAllocator::
                     allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                               (&((this->super_ModuleInstanceResolver).
                                  super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                &(qi->super_Expression).super_Statement.super_ASTObject.context,
                                pPVar10);
          }
          else {
            local_168.object = (Expression *)0x0;
            pQVar9 = (QualifiedIdentifier *)
                     getOrCreateImplicitProcessorInstance
                               (this,&(qi->super_Expression).super_Statement.super_ASTObject.context
                                ,pPVar10,&local_168);
          }
          goto LAB_001e9bd3;
        }
        e = (EndpointDeclaration *)
            __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,&AST::EndpointDeclaration::typeinfo,0);
        if ((e != (EndpointDeclaration *)0x0) && ((e->details).object != (EndpointDetails *)0x0)) {
          pQVar9 = (QualifiedIdentifier *)
                   ASTUtilities::createEndpointRef
                             ((this->super_ModuleInstanceResolver).
                              super_ErrorIgnoringRewritingASTVisitor.allocator,
                              &(qi->super_Expression).super_Statement.super_ASTObject.context,e);
          goto LAB_001e9bd3;
        }
      }
    }
    else if ((uVar3 != 0) &&
            (pNVar8 = (Namespace *)
                      __dynamic_cast(uVar3,&AST::ASTObject::typeinfo,&AST::Namespace::typeinfo),
            pNVar8 != (Namespace *)0x0)) {
      local_170.object = (pPVar12->specialisationArgs).object;
      AST::CommaSeparatedList::getAsExpressionList
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)&local_2b0,
                 &local_170);
      params = &(pNVar8->super_ModuleBase).specialisationParams;
      bVar6 = ModuleInstanceResolver::validateSpecialisationArgs
                        (&this->super_ModuleInstanceResolver,(ArgList *)&local_2b0,params,false);
      if (!bVar6) {
        (*(pNVar8->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(local_318 + 8,pNVar8);
        CompileMessageHelpers::createMessage<soul::IdentifierPath>
                  (&local_d8,syntax,error,"Wrong number of arguments to instantiate namespace $Q0$",
                   (IdentifierPath *)(local_318 + 8));
        AST::Context::throwError
                  (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_d8,false);
      }
      bVar6 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                        (&this->super_ModuleInstanceResolver,(ArgList *)&local_2b0,params);
      if (bVar6) {
        pNVar8 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                           (&this->super_ModuleInstanceResolver,pNVar8,(ArgList *)&local_2b0);
        updateQualifiedIdentifierPrefix(this,qi,pNVar8);
        std::
        vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
        ::_M_erase(this_00,(this_00->
                           super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        goto LAB_001e97ca;
      }
LAB_001e9801:
      local_2b0.pathSections.numActive = 0;
      if ((4 < local_2b0.pathSections.numAllocated) &&
         (local_2b0.pathSections.items != (Identifier *)0x0)) {
        operator_delete__(local_2b0.pathSections.items);
      }
    }
  }
  else if (local_230.itemsFound.numActive == 0) {
    IdentifierPath::operator+
              ((IdentifierPath *)(local_318 + 8),this_01,
               &((this_00->
                 super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 )._M_impl.super__Vector_impl_data._M_start)->path);
    sVar5 = local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
            super_RewritingASTVisitor.itemsReplaced;
    local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
    super_RewritingASTVisitor.itemsReplaced = 0;
    if (((Allocator *)0x8 <
         local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.owner) &&
       ((QualifiedIdentifier *)
        local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
        super_RewritingASTVisitor._vptr_RewritingASTVisitor != (QualifiedIdentifier *)0x0)) {
      operator_delete__(local_310.super_ModuleInstanceResolver.
                        super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
                        _vptr_RewritingASTVisitor);
    }
    if ((ResolutionPass *)0x1 < sVar5) {
      local_310.numVariablesResolved = 0;
      findParameterisedNamespace
                ((QualifiedIdentifierResolver *)local_318,(QualifiedIdentifier *)this,(int *)qi);
      if (local_318 != (undefined1  [8])0x0) {
        local_150.object =
             (((this_00->
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               )._M_impl.super__Vector_impl_data._M_start)->specialisationArgs).object;
        AST::CommaSeparatedList::getAsExpressionList
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)&local_2b0,
                   &local_150);
        if (local_318 == (undefined1  [8])0x0) {
LAB_001e9c8c:
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        bVar6 = ModuleInstanceResolver::validateSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,(ArgList *)&local_2b0,
                           &((ModuleBase *)local_318)->specialisationParams,false);
        if (!bVar6) {
          if (local_318 != (undefined1  [8])0x0) {
            (*(((ModuleBase *)local_318)->super_ASTObject)._vptr_ASTObject[0xe])(local_318 + 8);
            CompileMessageHelpers::createMessage<soul::IdentifierPath>
                      (&local_68,syntax,error,
                       "Wrong number of arguments to instantiate namespace $Q0$",
                       (IdentifierPath *)(local_318 + 8));
            AST::Context::throwError
                      (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_68,
                       false);
          }
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        if (local_318 == (undefined1  [8])0x0) goto LAB_001e9c8c;
        bVar6 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,(ArgList *)&local_2b0,
                           &((ModuleBase *)local_318)->specialisationParams);
        if (!bVar6) goto LAB_001e9801;
        if (local_318 == (undefined1  [8])0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        pNVar8 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                           (&this->super_ModuleInstanceResolver,(Namespace *)local_318,
                            (ArgList *)&local_2b0);
        updateQualifiedIdentifierPrefix(this,qi,pNVar8);
        pPVar12 = (this_00->
                  super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        IdentifierPath::removeFirst
                  (&pPVar12->path,
                   (long)(int)(pPVar12->path).pathSections.numActive -
                   (long)(int)local_310.numVariablesResolved);
LAB_001e97ca:
        psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                  super_RewritingASTVisitor.itemsReplaced;
        *psVar1 = *psVar1 + 1;
        local_2b0.pathSections.numActive = 0;
        if ((4 < local_2b0.pathSections.numAllocated) &&
           (local_2b0.pathSections.items != (Identifier *)0x0)) {
          operator_delete__(local_2b0.pathSections.items);
        }
        goto LAB_001e9bd3;
      }
    }
  }
  getBuiltInConstant((QualifiedIdentifierResolver *)(local_318 + 8),(QualifiedIdentifier *)this);
  pQVar9 = (QualifiedIdentifier *)
           local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
           super_RewritingASTVisitor._vptr_RewritingASTVisitor;
  if (((QualifiedIdentifier *)
       local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
       super_RewritingASTVisitor._vptr_RewritingASTVisitor == (QualifiedIdentifier *)0x0) &&
     (ASTUtilities::createConsoleEndpoint
                ((ASTUtilities *)(local_318 + 8),
                 (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator,qi),
     pQVar9 = (QualifiedIdentifier *)
              local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
              super_RewritingASTVisitor._vptr_RewritingASTVisitor,
     (QualifiedIdentifier *)
     local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
     super_RewritingASTVisitor._vptr_RewritingASTVisitor == (QualifiedIdentifier *)0x0)) {
    if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
        true) {
      psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails
      ;
      *psVar1 = *psVar1 + 1;
      pQVar9 = qi;
    }
    else {
      IdentifierPath::operator+
                ((IdentifierPath *)(local_318 + 8),this_01,
                 &((this_00->
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   )._M_impl.super__Vector_impl_data._M_start)->path);
      bVar6 = IdentifierPath::isUnqualifiedName((IdentifierPath *)(local_318 + 8),"wrap");
      bVar7 = true;
      if (!bVar6) {
        IdentifierPath::operator+
                  (&local_2b0,this_01,
                   &((this_00->
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     )._M_impl.super__Vector_impl_data._M_start)->path);
        bVar7 = IdentifierPath::isUnqualifiedName(&local_2b0,"clamp");
        local_2b0.pathSections.numActive = 0;
        if ((8 < local_2b0.pathSections.numAllocated) &&
           (local_2b0.pathSections.items != (Identifier *)0x0)) {
          operator_delete__(local_2b0.pathSections.items);
        }
      }
      local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
      super_RewritingASTVisitor.itemsReplaced = 0;
      if (((Allocator *)0x8 <
           local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.owner) &&
         ((QualifiedIdentifier *)
          local_310.super_ModuleInstanceResolver.super_ErrorIgnoringRewritingASTVisitor.
          super_RewritingASTVisitor._vptr_RewritingASTVisitor != (QualifiedIdentifier *)0x0)) {
        operator_delete__(local_310.super_ModuleInstanceResolver.
                          super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
                          _vptr_RewritingASTVisitor);
      }
      pQVar9 = qi;
      if (bVar7 == false) {
        this_03 = &(qi->super_Expression).super_Statement.super_ASTObject.context;
        if (local_230.itemsFound.numActive < 2) {
          IdentifierPath::operator+
                    ((IdentifierPath *)(local_318 + 8),this_01,
                     &((this_00->
                       super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                       )._M_impl.super__Vector_impl_data._M_start)->path);
          CompileMessageHelpers::createMessage<soul::IdentifierPath>
                    (&local_148,syntax,error,"Cannot find symbol $Q0$",
                     (IdentifierPath *)(local_318 + 8));
          AST::Context::throwError(this_03,&local_148,false);
        }
        IdentifierPath::operator+
                  ((IdentifierPath *)(local_318 + 8),this_01,
                   &((this_00->
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     )._M_impl.super__Vector_impl_data._M_start)->path);
        CompileMessageHelpers::createMessage<soul::IdentifierPath>
                  (&local_110,syntax,error,"Multiple matches found when looking for $Q0$",
                   (IdentifierPath *)(local_318 + 8));
        AST::Context::throwError(this_03,&local_110,false);
      }
    }
  }
LAB_001e9bd3:
  local_230.partiallyQualifiedPath.pathSections.numActive = 0;
  if (8 < local_230.partiallyQualifiedPath.pathSections.numAllocated) {
    if (local_230.partiallyQualifiedPath.pathSections.items != (Identifier *)0x0) {
      operator_delete__(local_230.partiallyQualifiedPath.pathSections.items);
    }
    local_230.partiallyQualifiedPath.pathSections.items =
         (Identifier *)local_230.partiallyQualifiedPath.pathSections.space;
    local_230.partiallyQualifiedPath.pathSections.numAllocated = 8;
  }
  local_230.itemsFound.numActive = 0;
  if ((8 < local_230.itemsFound.numAllocated) &&
     (local_230.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_230.itemsFound.items);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return &pQVar9->super_Expression;
}

Assistant:

AST::Expression& visit (AST::QualifiedIdentifier& qi) override
        {
            super::visit (qi);

            auto path = qi.getPath().toString();

            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = qi.getPath();
            search.stopAtFirstScopeWithResults = true;
            search.findVariables = true;
            search.findTypes = true;
            search.findFunctions = false;
            search.findNamespaces = true;
            search.findProcessors = true;
            search.findProcessorInstances = (parsingProcessorInstance == 0);
            search.findEndpoints = true;

            if (auto scope = qi.getParentScope())
                scope->performFullNameSearch (search, currentStatement.get());

            if (search.itemsFound.size() == 0)
            {
                if (qi.getPath().isQualified())
                {
                    int itemsRemoved = 0;
                    auto targetNamespace = findParameterisedNamespace (qi, itemsRemoved);

                    if (targetNamespace != nullptr)
                    {
                        auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                        if (! validateSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams, false))
                            qi.context.throwError (Errors::wrongNumArgsForNamespace (targetNamespace->getFullyQualifiedDisplayPath()));

                        if (canResolveAllSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams))
                        {
                            auto& resolvedNamespace = getOrAddNamespaceSpecialisation (*targetNamespace, specialisationArgs);
                            updateQualifiedIdentifierPrefix (qi, resolvedNamespace);
                            auto itemsToRemove = static_cast<size_t> (static_cast<int> (qi.pathSections[0].path.size()) - itemsRemoved);
                            qi.pathSections[0].path.removeFirst (itemsToRemove);
                            ++itemsReplaced;
                            return qi;
                        }
                    }
                }
            }
            else if (search.itemsFound.size() == 1)
            {
                auto item = search.itemsFound.front();

                if (qi.isSimplePath())
                {
                    if (auto s = cast<AST::StructDeclaration> (item))
                        return allocator.allocate<AST::StructDeclarationRef> (qi.context, *s);

                    if (auto e = cast<AST::Expression> (item))
                        return *e;

                    if (auto v = cast<AST::VariableDeclaration> (item))
                    {
                        ++numVariablesResolved;
                        return allocator.allocate<AST::VariableRef> (qi.context, *v);
                    }

                    if (auto p = cast<AST::ProcessorBase> (item))
                    {
                        if (currentConnectionEndpoint != nullptr)
                        {
                            auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                            if (! validateSpecialisationArgs (specialisationArgs, p->specialisationParams, false))
                                return qi;

                            return getOrCreateImplicitProcessorInstance (qi.context, *p, {});
                        }

                        return allocator.allocate<AST::ProcessorRef> (qi.context, *p);
                    }

                    if (auto n = cast<AST::Namespace> (item))
                        return allocator.allocate<AST::NamespaceRef> (qi.context, *n);

                    if (auto na = cast<AST::NamespaceAliasDeclaration> (item))
                    {
                        if (na->isResolved())
                            return allocator.allocate<AST::NamespaceRef> (qi.context, *na->resolvedNamespace);

                        if (na->targetNamespace == &qi)
                            qi.context.throwError (Errors::circularNamespaceAlias (qi.getPath()));
                    }

                    if (auto p = cast<AST::ProcessorInstance> (item))
                        return allocator.allocate<AST::ProcessorInstanceRef> (qi.context, *p);

                    if (auto pa = cast<AST::ProcessorAliasDeclaration> (item))
                    {
                        if (pa->isResolved())
                        {
                            if (currentConnectionEndpoint != nullptr)
                                return getOrCreateImplicitProcessorInstance (qi.context, *pa->resolvedProcessor, {});

                            return allocator.allocate<AST::ProcessorRef> (qi.context, *pa->resolvedProcessor);
                        }
                    }

                    if (auto e = cast<AST::EndpointDeclaration> (item))
                        if (! e->isUnresolvedChildReference())
                            return ASTUtilities::createEndpointRef (allocator, qi.context, *e);
                }
                else
                {
                    if (auto targetNamespace = cast<AST::Namespace> (item))
                    {
                        auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                        if (! validateSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams, false))
                            qi.context.throwError (Errors::wrongNumArgsForNamespace (targetNamespace->getFullyQualifiedDisplayPath()));

                        if (canResolveAllSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams))
                        {
                            auto& resolvedNamespace = getOrAddNamespaceSpecialisation (*targetNamespace, specialisationArgs);
                            updateQualifiedIdentifierPrefix (qi, resolvedNamespace);

                            qi.pathSections.erase (qi.pathSections.begin());
                            ++itemsReplaced;
                            return qi;
                        }

                    }
                }
            }


            if (auto builtInConstant = getBuiltInConstant (qi))
                return *builtInConstant;

            if (auto consoleEndpoint = ASTUtilities::createConsoleEndpoint (allocator, qi))
                return *consoleEndpoint;

            if (ignoreErrors)
            {
                ++numFails;
            }
            else
            {
                if (qi.getPath().isUnqualifiedName ("wrap") || qi.getPath().isUnqualifiedName ("clamp"))
                    return qi;

                if (search.itemsFound.size() > 1)
                    qi.context.throwError (Errors::ambiguousSymbol (qi.getPath()));

                qi.context.throwError (Errors::unresolvedSymbol (qi.getPath()));
            }

            return qi;
        }